

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O0

void __thiscall
ot::commissioner::JoinerSession::JoinerSession
          (JoinerSession *this,CommissionerImpl *aCommImpl,ByteArray *aJoinerId,string *aJoinerPSkd,
          uint16_t aJoinerUdpPort,uint16_t aJoinerRouterLocator,Address *aJoinerAddr,
          uint16_t aJoinerPort,Address *aLocalAddr,uint16_t aLocalPort)

{
  bool bVar1;
  event_base *aEventBase;
  element_type *aEndpoint;
  ErrorCode local_cc;
  Error local_c8;
  anon_class_8_1_8991fb9c local_a0;
  RequestHandler local_98;
  allocator local_71;
  string local_70;
  shared_ptr<ot::commissioner::JoinerSession::RelaySocket> local_49;
  uint16_t local_2c;
  uint16_t local_2a;
  uint16_t aJoinerRouterLocator_local;
  string *psStack_28;
  uint16_t aJoinerUdpPort_local;
  string *aJoinerPSkd_local;
  ByteArray *aJoinerId_local;
  CommissionerImpl *aCommImpl_local;
  JoinerSession *this_local;
  
  local_2c = aJoinerRouterLocator;
  local_2a = aJoinerUdpPort;
  psStack_28 = aJoinerPSkd;
  aJoinerPSkd_local = (string *)aJoinerId;
  aJoinerId_local = (ByteArray *)aCommImpl;
  aCommImpl_local = (CommissionerImpl *)this;
  std::enable_shared_from_this<ot::commissioner::JoinerSession>::enable_shared_from_this
            (&this->super_enable_shared_from_this<ot::commissioner::JoinerSession>);
  this->mCommImpl = (CommissionerImpl *)aJoinerId_local;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->mJoinerId,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)aJoinerPSkd_local);
  std::__cxx11::string::string((string *)&this->mJoinerPSKd,(string *)psStack_28);
  this->mJoinerUdpPort = local_2a;
  this->mJoinerRouterLocator = local_2c;
  std::
  make_shared<ot::commissioner::JoinerSession::RelaySocket,ot::commissioner::JoinerSession&,ot::commissioner::Address_const&,unsigned_short&,ot::commissioner::Address_const&,unsigned_short&>
            ((JoinerSession *)&this->mRelaySocket,(Address *)this,(unsigned_short *)aJoinerAddr,
             (Address *)&aJoinerPort,(unsigned_short *)aLocalAddr);
  local_49.
  super___shared_ptr<ot::commissioner::JoinerSession::RelaySocket,_(__gnu_cxx::_Lock_policy)2>._1_8_
       = CommissionerImpl::GetEventBase((CommissionerImpl *)aJoinerId_local);
  local_49.
  super___shared_ptr<ot::commissioner::JoinerSession::RelaySocket,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_1_ = 1;
  std::
  make_shared<ot::commissioner::DtlsSession,event_base*,bool,std::shared_ptr<ot::commissioner::JoinerSession::RelaySocket>&>
            ((event_base **)&this->mDtlsSession,
             (bool *)((long)&local_49.
                             super___shared_ptr<ot::commissioner::JoinerSession::RelaySocket,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + 1),&local_49);
  aEventBase = CommissionerImpl::GetEventBase((CommissionerImpl *)aJoinerId_local);
  aEndpoint = std::
              __shared_ptr_access<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mDtlsSession);
  coap::Coap::Coap(&this->mCoap,aEventBase,&aEndpoint->super_Endpoint);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"/c/jf",&local_71);
  local_a0.this = this;
  std::function<void(ot::commissioner::coap::Message_const&)>::
  function<ot::commissioner::JoinerSession::JoinerSession(ot::commissioner::CommissionerImpl&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,std::__cxx11::string_const&,unsigned_short,unsigned_short,ot::commissioner::Address_const&,unsigned_short,ot::commissioner::Address_const&,unsigned_short)::__0,void>
            ((function<void(ot::commissioner::coap::Message_const&)> *)&local_98,&local_a0);
  coap::Resource::Resource(&this->mResourceJoinFin,&local_70,&local_98);
  std::function<void_(const_ot::commissioner::coap::Message_&)>::~function(&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->mExpirationTime);
  coap::Coap::AddResource(&local_c8,&this->mCoap,&this->mResourceJoinFin);
  local_cc = kNone;
  bVar1 = commissioner::operator==(&local_c8,&local_cc);
  Error::~Error(&local_c8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  abort();
}

Assistant:

JoinerSession::JoinerSession(CommissionerImpl  &aCommImpl,
                             const ByteArray   &aJoinerId,
                             const std::string &aJoinerPSkd,
                             uint16_t           aJoinerUdpPort,
                             uint16_t           aJoinerRouterLocator,
                             const Address     &aJoinerAddr,
                             uint16_t           aJoinerPort,
                             const Address     &aLocalAddr,
                             uint16_t           aLocalPort)
    : mCommImpl(aCommImpl)
    , mJoinerId(aJoinerId)
    , mJoinerPSKd(aJoinerPSkd)
    , mJoinerUdpPort(aJoinerUdpPort)
    , mJoinerRouterLocator(aJoinerRouterLocator)
    , mRelaySocket(std::make_shared<RelaySocket>(*this, aJoinerAddr, aJoinerPort, aLocalAddr, aLocalPort))
    , mDtlsSession(std::make_shared<DtlsSession>(aCommImpl.GetEventBase(), /* aIsServer */ true, mRelaySocket))
    , mCoap(aCommImpl.GetEventBase(), *mDtlsSession)
    , mResourceJoinFin(uri::kJoinFin, [this](const coap::Request &aRequest) { HandleJoinFin(aRequest); })
{
    SuccessOrDie(mCoap.AddResource(mResourceJoinFin));
}